

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

CURLcode Curl_ssl_addsessionid(connectdata *conn,void *ssl_sessionid,size_t idsize,int sockindex)

{
  Curl_easy *pCVar1;
  Curl_share *pCVar2;
  ulong uVar3;
  curl_ssl_session *pcVar4;
  _Bool _Var5;
  int iVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  byte bVar11;
  curl_ssl_session *session;
  long *plVar12;
  long lVar13;
  long lVar14;
  
  pCVar1 = conn->data;
  session = (pCVar1->state).session;
  if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
    _Var5 = (conn->bits).proxy_ssl_connected[sockindex];
    lVar14 = 0x340;
    if (_Var5 != false) {
      lVar14 = 0x2f0;
    }
    lVar7 = 0x158;
    if (_Var5 != false) {
      lVar7 = 0xd0;
    }
    bVar11 = _Var5 ^ 1;
  }
  else {
    lVar7 = 0xd0;
    lVar14 = 0x2f0;
    bVar11 = 0;
  }
  lVar13 = session->age;
  pcVar8 = (*Curl_cstrdup)(*(char **)((conn->chunk).hexbuffer + lVar7 + -0x20));
  if (pcVar8 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  if ((conn->bits).conn_to_host == true) {
    pcVar9 = (*Curl_cstrdup)((conn->conn_to_host).name);
    if (pcVar9 == (char *)0x0) {
      (*Curl_cfree)(pcVar8);
      return CURLE_OUT_OF_MEMORY;
    }
  }
  else {
    pcVar9 = (char *)0x0;
  }
  iVar6 = -1;
  if ((conn->bits).conn_to_port == true) {
    iVar6 = conn->conn_to_port;
  }
  pCVar2 = pCVar1->share;
  if ((pCVar2 == (Curl_share *)0x0) || ((pCVar2->specifier & 0x10) == 0)) {
    plVar12 = &(pCVar1->state).sessionage;
  }
  else {
    plVar12 = &pCVar2->sessionage;
  }
  uVar3 = (pCVar1->set).general_ssl.max_ssl_sessions;
  uVar10 = 1;
  if (uVar3 < 2) {
LAB_00452482:
    if (uVar10 != uVar3) {
      session = (pCVar1->state).session + uVar10;
      goto LAB_004524a3;
    }
  }
  else {
    pcVar4 = (pCVar1->state).session;
    do {
      if (pcVar4[1].sessionid == (void *)0x0) goto LAB_00452482;
      if (pcVar4[1].age < lVar13) {
        session = pcVar4 + 1;
        lVar13 = pcVar4[1].age;
      }
      uVar10 = uVar10 + 1;
      pcVar4 = pcVar4 + 1;
    } while (uVar3 != uVar10);
  }
  Curl_ssl_kill_session(session);
LAB_004524a3:
  session->sessionid = ssl_sessionid;
  session->idsize = idsize;
  session->age = *plVar12;
  (*Curl_cfree)(session->name);
  (*Curl_cfree)(session->conn_to_host);
  session->name = pcVar8;
  session->conn_to_host = pcVar9;
  session->conn_to_port = iVar6;
  if (bVar11 == 0) {
    iVar6 = conn->remote_port;
  }
  else {
    iVar6 = (int)conn->port;
  }
  session->remote_port = iVar6;
  session->scheme = conn->handler->scheme;
  _Var5 = Curl_clone_primary_ssl_config
                    ((ssl_primary_config *)((conn->chunk).hexbuffer + lVar14 + -0x20),
                     &session->ssl_config);
  if (!_Var5) {
    session->sessionid = (void *)0x0;
    (*Curl_cfree)(pcVar8);
    (*Curl_cfree)(pcVar9);
    return CURLE_OUT_OF_MEMORY;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_ssl_addsessionid(struct connectdata *conn,
                               void *ssl_sessionid,
                               size_t idsize,
                               int sockindex)
{
  size_t i;
  struct Curl_easy *data = conn->data; /* the mother of all structs */
  struct curl_ssl_session *store = &data->state.session[0];
  long oldest_age = data->state.session[0].age; /* zero if unused */
  char *clone_host;
  char *clone_conn_to_host;
  int conn_to_port;
  long *general_age;
  const bool isProxy = CONNECT_PROXY_SSL();
  struct ssl_primary_config * const ssl_config = isProxy ?
    &conn->proxy_ssl_config :
    &conn->ssl_config;

  DEBUGASSERT(SSL_SET_OPTION(primary.sessionid));

  clone_host = strdup(isProxy ? conn->http_proxy.host.name : conn->host.name);
  if(!clone_host)
    return CURLE_OUT_OF_MEMORY; /* bail out */

  if(conn->bits.conn_to_host) {
    clone_conn_to_host = strdup(conn->conn_to_host.name);
    if(!clone_conn_to_host) {
      free(clone_host);
      return CURLE_OUT_OF_MEMORY; /* bail out */
    }
  }
  else
    clone_conn_to_host = NULL;

  if(conn->bits.conn_to_port)
    conn_to_port = conn->conn_to_port;
  else
    conn_to_port = -1;

  /* Now we should add the session ID and the host name to the cache, (remove
     the oldest if necessary) */

  /* If using shared SSL session, lock! */
  if(SSLSESSION_SHARED(data)) {
    general_age = &data->share->sessionage;
  }
  else {
    general_age = &data->state.sessionage;
  }

  /* find an empty slot for us, or find the oldest */
  for(i = 1; (i < data->set.general_ssl.max_ssl_sessions) &&
        data->state.session[i].sessionid; i++) {
    if(data->state.session[i].age < oldest_age) {
      oldest_age = data->state.session[i].age;
      store = &data->state.session[i];
    }
  }
  if(i == data->set.general_ssl.max_ssl_sessions)
    /* cache is full, we must "kill" the oldest entry! */
    Curl_ssl_kill_session(store);
  else
    store = &data->state.session[i]; /* use this slot */

  /* now init the session struct wisely */
  store->sessionid = ssl_sessionid;
  store->idsize = idsize;
  store->age = *general_age;    /* set current age */
  /* free it if there's one already present */
  free(store->name);
  free(store->conn_to_host);
  store->name = clone_host;               /* clone host name */
  store->conn_to_host = clone_conn_to_host; /* clone connect to host name */
  store->conn_to_port = conn_to_port; /* connect to port number */
  /* port number */
  store->remote_port = isProxy ? (int)conn->port : conn->remote_port;
  store->scheme = conn->handler->scheme;

  if(!Curl_clone_primary_ssl_config(ssl_config, &store->ssl_config)) {
    store->sessionid = NULL; /* let caller free sessionid */
    free(clone_host);
    free(clone_conn_to_host);
    return CURLE_OUT_OF_MEMORY;
  }

  return CURLE_OK;
}